

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O1

int __thiscall
asio::detail::reactive_socket_service<asio::ip::udp>::bind
          (reactive_socket_service<asio::ip::udp> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  sa_family_t sVar1;
  int iVar2;
  error_code *this_00;
  int iVar3;
  int *piVar4;
  error_category *peVar5;
  undefined4 in_register_0000000c;
  socklen_t __len_00;
  undefined4 in_register_00000034;
  
  this_00 = (error_code *)CONCAT44(in_register_0000000c,__len);
  iVar2 = *(int *)CONCAT44(in_register_00000034,__fd);
  if (iVar2 == -1) {
    std::error_code::operator=(this_00,bad_descriptor);
  }
  else {
    sVar1 = __addr->sa_family;
    piVar4 = __errno_location();
    *piVar4 = 0;
    __len_00 = 0x1c;
    if (sVar1 == 2) {
      __len_00 = 0x10;
    }
    iVar3 = ::bind(iVar2,__addr,__len_00);
    iVar2 = *piVar4;
    if (system_category()::instance == '\0') {
      bind();
    }
    this_00->_M_value = iVar2;
    this_00->_M_cat = (error_category *)&system_category()::instance;
    if (iVar3 == 0) {
      peVar5 = (error_category *)std::_V2::system_category();
      this_00->_M_value = 0;
      this_00->_M_cat = peVar5;
    }
  }
  return this_00->_M_value;
}

Assistant:

asio::error_code bind(implementation_type& impl,
      const endpoint_type& endpoint, asio::error_code& ec)
  {
    socket_ops::bind(impl.socket_, endpoint.data(), endpoint.size(), ec);
    return ec;
  }